

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O2

void __thiscall so_5::env_infrastructures::default_mt::impl::coop_repo_t::start(coop_repo_t *this)

{
  mchain_params_t *params;
  environment_t local_68 [2];
  _Any_data local_40;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined1 local_20;
  
  params = (mchain_params_t *)
           so_5::impl::coop_repository_basis_t::environment(&this->super_coop_repository_basis_t);
  local_68[0].m_impl._M_t.
  super___uniq_ptr_impl<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::environment_t::internals_t_*,_std::default_delete<so_5::environment_t::internals_t>_>
  .super__Head_base<0UL,_so_5::environment_t::internals_t_*,_false>._M_head_impl._0_1_ = 1;
  local_40._M_unused._M_object = (void *)0x0;
  local_40._8_8_ = 0;
  uStack_30 = 0;
  uStack_28 = 0;
  local_20 = 1;
  environment_t::create_mchain(local_68,params);
  intrusive_ptr_t<so_5::abstract_message_chain_t>::operator=
            (&this->m_final_dereg_chain,(intrusive_ptr_t<so_5::abstract_message_chain_t> *)local_68)
  ;
  intrusive_ptr_t<so_5::abstract_message_chain_t>::dismiss_object
            ((intrusive_ptr_t<so_5::abstract_message_chain_t> *)local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  local_68[0]._vptr_environment_t = (_func_int **)0x0;
  local_68[0].m_impl._M_t.
  super___uniq_ptr_impl<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_so_5::environment_t::internals_t_*,_std::default_delete<so_5::environment_t::internals_t>_>
  .super__Head_base<0UL,_so_5::environment_t::internals_t_*,_false>._M_head_impl =
       (__uniq_ptr_data<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>,_true,_true>
        )operator_new(0x10);
  (((internals_t *)
   local_68[0].m_impl._M_t.
   super___uniq_ptr_impl<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>_>
   ._M_t.
   super__Tuple_impl<0UL,_so_5::environment_t::internals_t_*,_std::default_delete<so_5::environment_t::internals_t>_>
   .super__Head_base<0UL,_so_5::environment_t::internals_t_*,_false>._M_head_impl)->m_error_logger).
  super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR___State_002c8890;
  (((internals_t *)
   local_68[0].m_impl._M_t.
   super___uniq_ptr_impl<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>_>
   ._M_t.
   super__Tuple_impl<0UL,_so_5::environment_t::internals_t_*,_std::default_delete<so_5::environment_t::internals_t>_>
   .super__Head_base<0UL,_so_5::environment_t::internals_t_*,_false>._M_head_impl)->m_error_logger).
  super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::thread::_M_start_thread(local_68,&local_68[0].m_impl,0);
  if (local_68[0].m_impl._M_t.
      super___uniq_ptr_impl<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>_>
      ._M_t.
      super__Tuple_impl<0UL,_so_5::environment_t::internals_t_*,_std::default_delete<so_5::environment_t::internals_t>_>
      .super__Head_base<0UL,_so_5::environment_t::internals_t_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>_>
       )0x0) {
    (*(code *)(((error_logger_shptr_t *)
               local_68[0].m_impl._M_t.
               super___uniq_ptr_impl<so_5::environment_t::internals_t,_std::default_delete<so_5::environment_t::internals_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_so_5::environment_t::internals_t_*,_std::default_delete<so_5::environment_t::internals_t>_>
               .super__Head_base<0UL,_so_5::environment_t::internals_t_*,_false>._M_head_impl)->
              super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              _vptr_error_logger_t)();
  }
  std::thread::operator=(&this->m_final_dereg_thread,(thread *)local_68);
  std::thread::~thread((thread *)local_68);
  return;
}

Assistant:

void
coop_repo_t::start()
{
	// mchain for final coop deregs must be created.
	m_final_dereg_chain = environment().create_mchain(
			make_unlimited_mchain_params().disable_msg_tracing() );
	// A separate thread for doing the final dereg must be started.
	m_final_dereg_thread = std::thread{ [this] {
		// Process dereg demands until chain will be closed.
		receive( from( m_final_dereg_chain ),
			[]( coop_t * coop ) {
				coop_t::call_final_deregister_coop( coop );
			} );
	} };
}